

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_NV_gpu_program4(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_NV_gpu_program4 != 0) {
    glad_glProgramLocalParameterI4iNV =
         (PFNGLPROGRAMLOCALPARAMETERI4INVPROC)(*load)("glProgramLocalParameterI4iNV");
    glad_glProgramLocalParameterI4ivNV =
         (PFNGLPROGRAMLOCALPARAMETERI4IVNVPROC)(*load)("glProgramLocalParameterI4ivNV");
    glad_glProgramLocalParametersI4ivNV =
         (PFNGLPROGRAMLOCALPARAMETERSI4IVNVPROC)(*load)("glProgramLocalParametersI4ivNV");
    glad_glProgramLocalParameterI4uiNV =
         (PFNGLPROGRAMLOCALPARAMETERI4UINVPROC)(*load)("glProgramLocalParameterI4uiNV");
    glad_glProgramLocalParameterI4uivNV =
         (PFNGLPROGRAMLOCALPARAMETERI4UIVNVPROC)(*load)("glProgramLocalParameterI4uivNV");
    glad_glProgramLocalParametersI4uivNV =
         (PFNGLPROGRAMLOCALPARAMETERSI4UIVNVPROC)(*load)("glProgramLocalParametersI4uivNV");
    glad_glProgramEnvParameterI4iNV =
         (PFNGLPROGRAMENVPARAMETERI4INVPROC)(*load)("glProgramEnvParameterI4iNV");
    glad_glProgramEnvParameterI4ivNV =
         (PFNGLPROGRAMENVPARAMETERI4IVNVPROC)(*load)("glProgramEnvParameterI4ivNV");
    glad_glProgramEnvParametersI4ivNV =
         (PFNGLPROGRAMENVPARAMETERSI4IVNVPROC)(*load)("glProgramEnvParametersI4ivNV");
    glad_glProgramEnvParameterI4uiNV =
         (PFNGLPROGRAMENVPARAMETERI4UINVPROC)(*load)("glProgramEnvParameterI4uiNV");
    glad_glProgramEnvParameterI4uivNV =
         (PFNGLPROGRAMENVPARAMETERI4UIVNVPROC)(*load)("glProgramEnvParameterI4uivNV");
    glad_glProgramEnvParametersI4uivNV =
         (PFNGLPROGRAMENVPARAMETERSI4UIVNVPROC)(*load)("glProgramEnvParametersI4uivNV");
    glad_glGetProgramLocalParameterIivNV =
         (PFNGLGETPROGRAMLOCALPARAMETERIIVNVPROC)(*load)("glGetProgramLocalParameterIivNV");
    glad_glGetProgramLocalParameterIuivNV =
         (PFNGLGETPROGRAMLOCALPARAMETERIUIVNVPROC)(*load)("glGetProgramLocalParameterIuivNV");
    glad_glGetProgramEnvParameterIivNV =
         (PFNGLGETPROGRAMENVPARAMETERIIVNVPROC)(*load)("glGetProgramEnvParameterIivNV");
    glad_glGetProgramEnvParameterIuivNV =
         (PFNGLGETPROGRAMENVPARAMETERIUIVNVPROC)(*load)("glGetProgramEnvParameterIuivNV");
  }
  return;
}

Assistant:

static void load_GL_NV_gpu_program4(GLADloadproc load) {
	if(!GLAD_GL_NV_gpu_program4) return;
	glad_glProgramLocalParameterI4iNV = (PFNGLPROGRAMLOCALPARAMETERI4INVPROC)load("glProgramLocalParameterI4iNV");
	glad_glProgramLocalParameterI4ivNV = (PFNGLPROGRAMLOCALPARAMETERI4IVNVPROC)load("glProgramLocalParameterI4ivNV");
	glad_glProgramLocalParametersI4ivNV = (PFNGLPROGRAMLOCALPARAMETERSI4IVNVPROC)load("glProgramLocalParametersI4ivNV");
	glad_glProgramLocalParameterI4uiNV = (PFNGLPROGRAMLOCALPARAMETERI4UINVPROC)load("glProgramLocalParameterI4uiNV");
	glad_glProgramLocalParameterI4uivNV = (PFNGLPROGRAMLOCALPARAMETERI4UIVNVPROC)load("glProgramLocalParameterI4uivNV");
	glad_glProgramLocalParametersI4uivNV = (PFNGLPROGRAMLOCALPARAMETERSI4UIVNVPROC)load("glProgramLocalParametersI4uivNV");
	glad_glProgramEnvParameterI4iNV = (PFNGLPROGRAMENVPARAMETERI4INVPROC)load("glProgramEnvParameterI4iNV");
	glad_glProgramEnvParameterI4ivNV = (PFNGLPROGRAMENVPARAMETERI4IVNVPROC)load("glProgramEnvParameterI4ivNV");
	glad_glProgramEnvParametersI4ivNV = (PFNGLPROGRAMENVPARAMETERSI4IVNVPROC)load("glProgramEnvParametersI4ivNV");
	glad_glProgramEnvParameterI4uiNV = (PFNGLPROGRAMENVPARAMETERI4UINVPROC)load("glProgramEnvParameterI4uiNV");
	glad_glProgramEnvParameterI4uivNV = (PFNGLPROGRAMENVPARAMETERI4UIVNVPROC)load("glProgramEnvParameterI4uivNV");
	glad_glProgramEnvParametersI4uivNV = (PFNGLPROGRAMENVPARAMETERSI4UIVNVPROC)load("glProgramEnvParametersI4uivNV");
	glad_glGetProgramLocalParameterIivNV = (PFNGLGETPROGRAMLOCALPARAMETERIIVNVPROC)load("glGetProgramLocalParameterIivNV");
	glad_glGetProgramLocalParameterIuivNV = (PFNGLGETPROGRAMLOCALPARAMETERIUIVNVPROC)load("glGetProgramLocalParameterIuivNV");
	glad_glGetProgramEnvParameterIivNV = (PFNGLGETPROGRAMENVPARAMETERIIVNVPROC)load("glGetProgramEnvParameterIivNV");
	glad_glGetProgramEnvParameterIuivNV = (PFNGLGETPROGRAMENVPARAMETERIUIVNVPROC)load("glGetProgramEnvParameterIuivNV");
}